

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.cpp
# Opt level: O0

JointPolicyPureVector * __thiscall
JointPolicyPureVector::operator=(JointPolicyPureVector *this,JointPolicyPureVector *o)

{
  JointPolicyPureVector *in_RSI;
  JointPolicyPureVector *in_RDI;
  JPolComponent_VectorImplementation *in_stack_00000040;
  JPolComponent_VectorImplementation *in_stack_00000048;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    JointPolicyDiscretePure::operator=
              (&in_RSI->super_JointPolicyDiscretePure,&in_RDI->super_JointPolicyDiscretePure);
    JPolComponent_VectorImplementation::operator=(in_stack_00000048,in_stack_00000040);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

JointPolicyPureVector& JointPolicyPureVector::operator= (const JointPolicyPureVector& o)
{
#if DEBUG_JPOLASSIGN 
    cout << "JointPolicyPureVector::operator=(const JointPolicyPureVector& jp) called"<<endl;
#endif
    if (this == &o) return *this;  // Gracefully handle self assignment
    // Put the normal assignment duties here...
    JointPolicyDiscretePure::operator=(o);
    JPolComponent_VectorImplementation::operator=(o);
    return *this;
}